

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

CoherentFlags __thiscall
anon_unknown.dwarf_d6fcf8::TGlslangToSpvTraverser::TranslateCoherent
          (TGlslangToSpvTraverser *this,TType *type)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  iVar4 = (*(this->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])();
  uVar1 = *(undefined8 *)(CONCAT44(extraout_var,iVar4) + 8);
  iVar4 = (*(this->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])(this);
  uVar2 = *(undefined8 *)(CONCAT44(extraout_var_00,iVar4) + 8);
  iVar4 = (*(this->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])(this);
  uVar3 = *(undefined8 *)(CONCAT44(extraout_var_01,iVar4) + 8);
  iVar4 = (*(this->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])(this);
  uVar6 = 8;
  if ((*(byte *)(CONCAT44(extraout_var_02,iVar4) + 0xe) & 0x40) == 0) {
    iVar4 = (*(this->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])(this);
    uVar6 = (uint)((*(uint *)(CONCAT44(extraout_var_03,iVar4) + 8) & 0x7f) == 7) << 3;
  }
  uVar8 = (uint)((ulong)uVar3 >> 0x33) & 4 |
          (uint)((ulong)uVar2 >> 0x33) & 2 | (uint)((ulong)uVar1 >> 0x31) & 1;
  iVar4 = (*(this->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])(this);
  uVar11 = (uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var_04,iVar4) + 8) >> 0x33) & 0x10;
  iVar4 = (*(this->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])(this);
  uVar10 = (uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var_05,iVar4) + 8) >> 0x33) & 0x20;
  iVar4 = (*(this->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])(this);
  uVar9 = (uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var_06,iVar4) + 8) >> 0x2b) & 0x80;
  iVar4 = (*(this->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])(this);
  uVar1 = *(undefined8 *)(CONCAT44(extraout_var_07,iVar4) + 8);
  iVar4 = (*(this->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])(this);
  uVar7 = uVar9 >> 1;
  if ((short)uVar10 != 0 || ((short)uVar11 != 0 || ((short)uVar6 != 0 || (short)uVar8 != 0))) {
    uVar7 = 0x40;
  }
  if ((*(ulong *)(CONCAT44(extraout_var_08,iVar4) + 8) >> 0x39 & 1) != 0) {
    uVar7 = 0x40;
  }
  iVar4 = (*(this->super_TIntermTraverser)._vptr_TIntermTraverser[7])(this);
  iVar5 = (*(this->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])(this);
  return (CoherentFlags)
         ((uint)(*(ulong *)(CONCAT44(extraout_var_09,iVar5) + 8) >> 0x17) & 0x400 |
         (uint)(iVar4 == 0xe) << 9 |
         (uint)((ulong)uVar1 >> 0x2b) & 0x100 | uVar9 | uVar10 | uVar11 | uVar6 | uVar8 | uVar7);
}

Assistant:

spv::Builder::AccessChain::CoherentFlags TGlslangToSpvTraverser::TranslateCoherent(const glslang::TType& type)
{
    spv::Builder::AccessChain::CoherentFlags flags = {};
    flags.coherent = type.getQualifier().coherent;
    flags.devicecoherent = type.getQualifier().devicecoherent;
    flags.queuefamilycoherent = type.getQualifier().queuefamilycoherent;
    // shared variables are implicitly workgroupcoherent in GLSL.
    flags.workgroupcoherent = type.getQualifier().workgroupcoherent ||
                              type.getQualifier().storage == glslang::EvqShared;
    flags.subgroupcoherent = type.getQualifier().subgroupcoherent;
    flags.shadercallcoherent = type.getQualifier().shadercallcoherent;
    flags.volatil = type.getQualifier().volatil;
    flags.nontemporal = type.getQualifier().nontemporal;
    // *coherent variables are implicitly nonprivate in GLSL
    flags.nonprivate = type.getQualifier().nonprivate ||
                       flags.anyCoherent() ||
                       flags.volatil;
    flags.isImage = type.getBasicType() == glslang::EbtSampler;
    flags.nonUniform = type.getQualifier().nonUniform;
    return flags;
}